

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall QDockAreaLayoutInfo::minimumSize(QDockAreaLayoutInfo *this)

{
  Representation RVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  QSize QVar5;
  ulong uVar6;
  Representation RVar7;
  int iVar8;
  Representation RVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  QDockAreaLayoutItem *this_00;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar14 = 0;
  uVar12 = 0;
  lVar11 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar12) {
      uVar12 = 0;
      goto LAB_003f4a66;
    }
    bVar2 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&((this->item_list).d.ptr)->widgetItem + lVar11));
    lVar11 = lVar11 + 0x28;
    uVar12 = uVar12 + 1;
  } while (bVar2);
  uVar12 = 0;
  uVar14 = 0;
  if (lVar11 != 0) {
    if ((this->item_list).d.size == 0) {
      uVar10 = 0;
      uVar15 = 0;
    }
    else {
      lVar11 = 0;
      bVar2 = true;
      uVar14 = 0;
      uVar15 = 0;
      uVar10 = 0;
      do {
        uVar13 = (uint)uVar15;
        this_00 = (QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar11);
        bVar3 = QDockAreaLayoutItem::skip(this_00);
        if (!bVar3) {
          QVar5 = QDockAreaLayoutItem::minimumSize(this_00);
          RVar7 = QVar5.ht.m_i;
          RVar1 = QVar5.wd.m_i;
          if (this->tabbed == true) {
            RVar9.m_i = RVar7.m_i;
            if (this->o == Horizontal) {
              RVar9.m_i = RVar1.m_i;
            }
            if (RVar9.m_i < (int)uVar13) {
              RVar9.m_i = uVar13;
            }
          }
          else {
            if (!bVar2) {
              uVar13 = uVar13 + *this->sep;
            }
            RVar9.m_i = RVar7.m_i;
            if (this->o == Horizontal) {
              RVar9.m_i = RVar1.m_i;
            }
            RVar9.m_i = RVar9.m_i + uVar13;
          }
          if (this->o == Vertical) {
            RVar7.m_i = RVar1.m_i;
          }
          if (RVar7.m_i < (int)uVar10) {
            RVar7.m_i = uVar10;
          }
          uVar10 = RVar7.m_i;
          bVar2 = false;
          uVar15 = (ulong)(uint)RVar9.m_i;
        }
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x28;
      } while (uVar14 < (ulong)(this->item_list).d.size);
    }
    uVar12 = 0xffffffff;
    if (this->o == Horizontal) {
      uVar12 = uVar15;
    }
    if (this->o == Vertical) {
      uVar12 = (ulong)uVar10;
    }
    else {
      uVar15 = (ulong)uVar10;
    }
    bVar2 = updateTabBar(this);
    if (bVar2) {
      uVar6 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x78))();
    }
    else {
      uVar6 = 0;
    }
    iVar4 = (int)uVar6;
    uVar14 = uVar15;
    if ((uVar6 >> 0x20 != 0 || iVar4 != 0) && ((uint)this->tabBarShape < 8)) {
      iVar8 = (int)(uVar6 >> 0x20);
      if ((0x33U >> (this->tabBarShape & 0x1fU) & 1) == 0) {
        uVar14 = uVar6 >> 0x20;
        if (iVar8 < (int)uVar15) {
          uVar14 = uVar15;
        }
        uVar12 = (ulong)(uint)((int)uVar12 + iVar4);
      }
      else {
        uVar14 = (ulong)(uint)((int)uVar15 + iVar8);
        if ((int)uVar12 <= iVar4) {
          uVar12 = uVar6 & 0xffffffff;
        }
      }
    }
  }
LAB_003f4a66:
  return (QSize)(uVar12 | uVar14 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::minimumSize() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize min_size = item.minimumSize();
#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, pick(o, min_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, min_size);
        }
        b = qMax(b, perp(o, min_size));

        first = false;
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbm = tabBarMinimumSize();
    if (!tbm.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbm.height();
                result.rwidth() = qMax(tbm.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbm.height(), result.height());
                result.rwidth() += tbm.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}